

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int UTF8ToUTF8(uchar *out,int *outlen,uchar *inb,int *inlenb)

{
  undefined4 local_34;
  int len;
  int *inlenb_local;
  uchar *inb_local;
  int *outlen_local;
  uchar *out_local;
  
  if (((out == (uchar *)0x0) || (outlen == (int *)0x0)) || (inlenb == (int *)0x0)) {
    out_local._4_4_ = -1;
  }
  else if (inb == (uchar *)0x0) {
    *outlen = 0;
    *inlenb = 0;
    out_local._4_4_ = 0;
  }
  else {
    if (*inlenb < *outlen) {
      local_34 = *inlenb;
    }
    else {
      local_34 = *outlen;
    }
    if (local_34 < 0) {
      out_local._4_4_ = -1;
    }
    else {
      memcpy(out,inb,(long)local_34);
      *outlen = local_34;
      *inlenb = local_34;
      out_local._4_4_ = *outlen;
    }
  }
  return out_local._4_4_;
}

Assistant:

static int
UTF8ToUTF8(unsigned char* out, int *outlen,
           const unsigned char* inb, int *inlenb)
{
    int len;

    if ((out == NULL) || (outlen == NULL) || (inlenb == NULL))
	return(-1);
    if (inb == NULL) {
        /* inb == NULL means output is initialized. */
        *outlen = 0;
        *inlenb = 0;
        return(0);
    }
    if (*outlen > *inlenb) {
	len = *inlenb;
    } else {
	len = *outlen;
    }
    if (len < 0)
	return(-1);

    memcpy(out, inb, len);

    *outlen = len;
    *inlenb = len;
    return(*outlen);
}